

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int simple_next_token(uint8_t **pp,BOOL no_line_terminator)

{
  int iVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  
  pbVar4 = *pp;
LAB_00124264:
  while( true ) {
    do {
      while( true ) {
        do {
          do {
            pbVar3 = pbVar4;
            pbVar4 = pbVar3 + 1;
            bVar2 = *pbVar3;
          } while (bVar2 - 0xb < 2);
        } while (bVar2 == 9);
        if ((bVar2 != 10) && (bVar2 != 0xd)) break;
        if (no_line_terminator != 0) {
          return 10;
        }
      }
    } while (bVar2 == 0x20);
    if (bVar2 != 0x2f) {
      if (bVar2 == 0x3d) {
        if (*pbVar4 == 0x3e) {
          return -0x5c;
        }
        return 0x3d;
      }
      uVar5 = (uint)bVar2;
      iVar1 = lre_js_is_ident_first((uint)bVar2);
      if (iVar1 == 0) {
        return uVar5;
      }
      if (uVar5 == 0x65) {
        if (((((*pbVar4 == 0x78) && (pbVar3[2] == 0x70)) && (pbVar3[3] == 0x6f)) &&
            ((pbVar3[4] == 0x72 && (pbVar3[5] == 0x74)))) &&
           (iVar1 = lre_js_is_ident_next((uint)pbVar3[6]), iVar1 == 0)) {
          *pp = pbVar3 + 6;
          return -0x35;
        }
      }
      else if (uVar5 == 0x66) {
        if ((((*pbVar4 == 0x75) && (pbVar3[2] == 0x6e)) &&
            ((pbVar3[3] == 99 &&
             (((pbVar3[4] == 0x74 && (pbVar3[5] == 0x69)) && (pbVar3[6] == 0x6f)))))) &&
           ((pbVar3[7] == 0x6e && (iVar1 = lre_js_is_ident_next((uint)pbVar3[8]), iVar1 == 0)))) {
          return -0x3b;
        }
      }
      else if (uVar5 == 0x6f) {
        if ((*pbVar4 == 0x66) && (iVar1 = lre_js_is_ident_next((uint)pbVar3[2]), iVar1 == 0)) {
          return -0x27;
        }
      }
      else if (uVar5 == 0x69) {
        bVar2 = *pbVar4;
        if (bVar2 == 0x6e) {
          iVar1 = lre_js_is_ident_next((uint)pbVar3[2]);
          if (iVar1 == 0) {
            return -0x49;
          }
          bVar2 = *pbVar4;
        }
        if ((((bVar2 == 0x6d) && (pbVar3[2] == 0x70)) && (pbVar3[3] == 0x6f)) &&
           (((pbVar3[4] == 0x72 && (pbVar3[5] == 0x74)) &&
            (iVar1 = lre_js_is_ident_next((uint)pbVar3[6]), iVar1 == 0)))) {
          *pp = pbVar3 + 6;
          return -0x33;
        }
      }
      return -0x7d;
    }
    if (*pbVar4 != 0x2f) break;
    if (no_line_terminator != 0) {
      return 10;
    }
    bVar2 = 0x2f;
    while ((0xd < bVar2 || ((0x2401U >> (bVar2 & 0x1f) & 1) == 0))) {
      bVar2 = pbVar4[1];
      pbVar4 = pbVar4 + 1;
    }
  }
  if (*pbVar4 != 0x2a) {
    return 0x2f;
  }
  pbVar4 = pbVar3 + 2;
  do {
    bVar2 = *pbVar4;
    if (bVar2 == 0xd) {
      if (no_line_terminator != 0) {
        return 10;
      }
    }
    else {
      if (bVar2 == 0) goto LAB_00124264;
      if ((no_line_terminator != 0) && (bVar2 == 10)) {
        return 10;
      }
      if ((bVar2 == 0x2a) && (pbVar4[1] == 0x2f)) break;
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
  pbVar4 = pbVar4 + 2;
  goto LAB_00124264;
}

Assistant:

static int simple_next_token(const uint8_t **pp, BOOL no_line_terminator)
{
    const uint8_t *p;
    uint32_t c;
    
    /* skip spaces and comments */
    p = *pp;
    for (;;) {
        switch(c = *p++) {
        case '\r':
        case '\n':
            if (no_line_terminator)
                return '\n';
            continue;
        case ' ':
        case '\t':
        case '\v':
        case '\f':
            continue;
        case '/':
            if (*p == '/') {
                if (no_line_terminator)
                    return '\n';
                while (*p && *p != '\r' && *p != '\n')
                    p++;
                continue;
            }
            if (*p == '*') {
                while (*++p) {
                    if ((*p == '\r' || *p == '\n') && no_line_terminator)
                        return '\n';
                    if (*p == '*' && p[1] == '/') {
                        p += 2;
                        break;
                    }
                }
                continue;
            }
            break;
        case '=':
            if (*p == '>')
                return TOK_ARROW;
            break;
        default:
            if (lre_js_is_ident_first(c)) {
                if (c == 'i') {
                    if (p[0] == 'n' && !lre_js_is_ident_next(p[1])) {
                        return TOK_IN;
                    }
                    if (p[0] == 'm' && p[1] == 'p' && p[2] == 'o' &&
                        p[3] == 'r' && p[4] == 't' &&
                        !lre_js_is_ident_next(p[5])) {
                        *pp = p + 5;
                        return TOK_IMPORT;
                    }
                } else if (c == 'o' && *p == 'f' && !lre_js_is_ident_next(p[1])) {
                    return TOK_OF;
                } else if (c == 'e' &&
                           p[0] == 'x' && p[1] == 'p' && p[2] == 'o' &&
                           p[3] == 'r' && p[4] == 't' &&
                           !lre_js_is_ident_next(p[5])) {
                    *pp = p + 5;
                    return TOK_EXPORT;
                } else if (c == 'f' && p[0] == 'u' && p[1] == 'n' &&
                         p[2] == 'c' && p[3] == 't' && p[4] == 'i' &&
                         p[5] == 'o' && p[6] == 'n' && !lre_js_is_ident_next(p[7])) {
                    return TOK_FUNCTION;
                }
                return TOK_IDENT;
            }
            break;
        }
        return c;
    }
}